

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.cpp
# Opt level: O0

bool __thiscall
chatra::ArgumentMatcher::matches
          (ArgumentMatcher *this,
          vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> *args,
          vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> *subArgs)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  size_type sVar4;
  value_type *pvVar5;
  const_reference pvVar6;
  reference __x;
  size_t sVar7;
  pointer pvVar8;
  bool local_a9;
  value_type *target_1;
  _Node_iterator_base<std::pair<const_chatra::StringId,_unsigned_long>,_false> local_80;
  const_iterator it;
  value_type *target;
  ArgumentSpec *arg;
  const_iterator __end1;
  const_iterator __begin1;
  vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> *__range1;
  size_t matchedCountWithoutDefaults;
  size_t index;
  value_type *arg1;
  value_type *arg0;
  size_t i;
  vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> *subArgs_local;
  vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> *args_local;
  ArgumentMatcher *this_local;
  
  sVar2 = std::vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>::size(args);
  if ((sVar2 == 1) &&
     (pvVar3 = std::vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>::operator[]
                         (args,0), pvVar3->key == AnyArgs)) {
    this_local._7_1_ = true;
  }
  else {
    sVar2 = std::vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>::size(subArgs);
    sVar4 = std::vector<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>::size
                      (&this->subArgs);
    if (sVar2 == sVar4) {
      for (arg0 = (value_type *)0x0;
          pvVar5 = (value_type *)
                   std::vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>::size
                             (subArgs), arg0 < pvVar5; arg0 = (value_type *)((long)&arg0->type + 1))
      {
        pvVar6 = std::vector<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>::operator[]
                           (&this->subArgs,(size_type)arg0);
        pvVar3 = std::vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>::
                 operator[](subArgs,(size_type)arg0);
        if (((pvVar6->cl != (Class *)0x0) && (pvVar3->cl != (Class *)0x0)) &&
           (bVar1 = Class::isAssignableFrom(pvVar6->cl,pvVar3->cl), !bVar1)) {
          return false;
        }
      }
      matchedCountWithoutDefaults = 0;
      __range1 = (vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> *)0x0;
      __end1 = std::vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>::begin(args)
      ;
      arg = (ArgumentSpec *)
            std::vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>::end(args);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<const_chatra::ArgumentSpec_*,_std::vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>_>
                                         *)&arg), bVar1) {
        __x = __gnu_cxx::
              __normal_iterator<const_chatra::ArgumentSpec_*,_std::vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>_>
              ::operator*(&__end1);
        if (matchedCountWithoutDefaults < this->listCount) {
          sVar7 = matchedCountWithoutDefaults + 1;
          it.super__Node_iterator_base<std::pair<const_chatra::StringId,_unsigned_long>,_false>.
          _M_cur = (_Node_iterator_base<std::pair<const_chatra::StringId,_unsigned_long>,_false>)
                   std::vector<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>::
                   operator[](&this->args,matchedCountWithoutDefaults);
          if (((__x->key != Invalid) &&
              (__x->key !=
               *(StringId *)
                ((long)&(((__node_type *)
                         it.
                         super__Node_iterator_base<std::pair<const_chatra::StringId,_unsigned_long>,_false>
                         ._M_cur)->super__Hash_node_base)._M_nxt + 4))) ||
             (((((__node_type *)
                it.
                super__Node_iterator_base<std::pair<const_chatra::StringId,_unsigned_long>,_false>.
                _M_cur)->
               super__Hash_node_value<std::pair<const_chatra::StringId,_unsigned_long>,_false>).
               super__Hash_node_value_base<std::pair<const_chatra::StringId,_unsigned_long>_>.
               _M_storage._M_storage.__align != (anon_struct_8_0_00000001_for___align)0x0 &&
              ((__x->cl != (Class *)0x0 &&
               (bVar1 = Class::isAssignableFrom
                                  ((Class *)(((__node_type *)
                                             it.
                                             super__Node_iterator_base<std::pair<const_chatra::StringId,_unsigned_long>,_false>
                                             ._M_cur)->
                                            super__Hash_node_value<std::pair<const_chatra::StringId,_unsigned_long>,_false>
                                            ).
                                            super__Hash_node_value_base<std::pair<const_chatra::StringId,_unsigned_long>_>
                                            ._M_storage._M_storage.__align,__x->cl), !bVar1)))))) {
            matchedCountWithoutDefaults = this->listCount;
            goto LAB_002c9f23;
          }
          matchedCountWithoutDefaults = sVar7;
          if (*(long *)((long)it.
                              super__Node_iterator_base<std::pair<const_chatra::StringId,_unsigned_long>,_false>
                              ._M_cur + 0x10) == 0) {
            __range1 = (vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> *)
                       ((long)&(__range1->
                               super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>
                               )._M_impl.super__Vector_impl_data._M_start + 1);
          }
        }
        else {
LAB_002c9f23:
          if (__x->key != Invalid) {
            local_80._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<chatra::StringId,_unsigned_long,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_unsigned_long>_>_>
                 ::find(&this->byName,&__x->key);
            target_1 = (value_type *)
                       std::
                       unordered_map<chatra::StringId,_unsigned_long,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_unsigned_long>_>_>
                       ::end(&this->byName);
            bVar1 = std::__detail::operator!=
                              (&local_80,
                               (_Node_iterator_base<std::pair<const_chatra::StringId,_unsigned_long>,_false>
                                *)&target_1);
            if (bVar1) {
              pvVar8 = std::__detail::
                       _Node_const_iterator<std::pair<const_chatra::StringId,_unsigned_long>,_false,_false>
                       ::operator->((_Node_const_iterator<std::pair<const_chatra::StringId,_unsigned_long>,_false,_false>
                                     *)&local_80);
              pvVar6 = std::vector<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>::
                       operator[](&this->args,pvVar8->second);
              if (((pvVar6->cl != (Class *)0x0) && (__x->cl != (Class *)0x0)) &&
                 (bVar1 = Class::isAssignableFrom(pvVar6->cl,__x->cl), !bVar1)) {
                return false;
              }
              if (pvVar6->defaultOp == (Node *)0x0) {
                __range1 = (vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> *)
                           ((long)&(__range1->
                                   super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>
                                   )._M_impl.super__Vector_impl_data._M_start + 1);
              }
              goto LAB_002ca016;
            }
          }
          if (((this->hasListVarArg & 1U) == 0) &&
             ((__x->key == Invalid || ((this->hasDictVarArg & 1U) == 0)))) {
            return false;
          }
        }
LAB_002ca016:
        __gnu_cxx::
        __normal_iterator<const_chatra::ArgumentSpec_*,_std::vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>_>
        ::operator++(&__end1);
      }
      local_a9 = false;
      if (this->listCountWithoutDefaults <= matchedCountWithoutDefaults) {
        local_a9 = __range1 ==
                   (vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> *)
                   (this->listCountWithoutDefaults + this->dictCountWithoutDefaults);
      }
      this_local._7_1_ = local_a9;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ArgumentMatcher::matches(const std::vector<ArgumentSpec>& args, const std::vector<ArgumentSpec>& subArgs) const {

	if (args.size() == 1 && args[0].key == StringId::AnyArgs)
		return true;

	if (subArgs.size() != this->subArgs.size())
		return false;
	for (size_t i = 0; i < subArgs.size(); i++) {
		auto& arg0 = this->subArgs[i];
		auto& arg1 = subArgs[i];
		if (arg0.cl != nullptr && arg1.cl != nullptr && !arg0.cl->isAssignableFrom(arg1.cl))
			return false;
	}

	size_t index = 0;
	size_t matchedCountWithoutDefaults = 0;

	for (auto& arg : args) {
		if (index < listCount) {
			auto& target = this->args[index++];
			if ((arg.key == StringId::Invalid || arg.key == target.name) &&
					(target.cl == nullptr || arg.cl == nullptr || target.cl->isAssignableFrom(arg.cl))) {
				if (target.defaultOp == nullptr)
					matchedCountWithoutDefaults++;
				continue;
			}
			index = listCount;
		}
		if (arg.key != StringId::Invalid) {
			auto it = byName.find(arg.key);
			if (it != byName.end()) {
				auto& target = this->args[it->second];
				if (target.cl != nullptr && arg.cl != nullptr && !target.cl->isAssignableFrom(arg.cl))
					return false;
				if (target.defaultOp == nullptr)
					matchedCountWithoutDefaults++;
				continue;
			}
		}
		if (hasListVarArg || (arg.key != StringId::Invalid && hasDictVarArg))
			continue;
		return false;
	}

	return index >= listCountWithoutDefaults &&
			matchedCountWithoutDefaults == listCountWithoutDefaults + dictCountWithoutDefaults;
}